

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int nsc_line_to_tag(char *buf,size_t size,char *tag,size_t max_tag,lws_usec_t *pexpiry)

{
  char cVar1;
  longlong lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong __n;
  ulong uVar6;
  ulong uVar7;
  long local_a8;
  int local_90;
  char col [64];
  
  iVar4 = 1;
  if (2 < size) {
    iVar4 = 0;
    local_a8 = 0;
    uVar7 = 0;
    for (uVar5 = 0; (uVar7 < size && (uVar5 < 6)); uVar5 = uVar5 + 1) {
      __n = 0;
      while( true ) {
        cVar1 = buf[__n + uVar7];
        if ((size <= uVar7 + __n) || (0x3e < __n)) break;
        if (cVar1 == '\t') {
          uVar6 = 1;
          goto LAB_0010ef73;
        }
        col[__n] = cVar1;
        __n = __n + 1;
      }
      uVar6 = (ulong)(cVar1 == '\t');
LAB_0010ef73:
      col[__n] = '\0';
      switch(uVar5) {
      case 0:
      case 2:
      case 5:
        local_90 = (int)max_tag;
        if (local_90 < iVar4 + (int)__n + 2) {
          return 1;
        }
        if (iVar4 == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = iVar4 + 1;
          tag[iVar4] = '|';
        }
        memcpy(tag + iVar3,col,__n);
        iVar4 = iVar3 + (int)__n;
        (tag + iVar3)[__n] = '\0';
        break;
      case 4:
        lVar2 = atoll(col);
        local_a8 = lVar2 * 1000000;
      }
      uVar7 = uVar6 + uVar7 + __n;
    }
    if (pexpiry != (lws_usec_t *)0x0) {
      *pexpiry = local_a8;
    }
    iVar4 = 0;
    _lws_log(8,"%s: %.*s: tag \'%s\'\n","nsc_line_to_tag",size & 0xffffffff,buf,tag);
  }
  return iVar4;
}

Assistant:

static int
nsc_line_to_tag(const char *buf, size_t size, char *tag, size_t max_tag,
		lws_usec_t *pexpiry)
{
	int n, idx = 0, tl = 0;
	lws_usec_t expiry = 0;
	size_t bn = 0;
	char col[64];

	if (size < 3)
		return 1;

	while (bn < size && idx <= NSC_COL_NAME) {

		n = 0;
		while (bn < size && n < (int)sizeof(col) - 1 &&
		       buf[bn] != '\t')
			col[n++] = buf[bn++];
		col[n] = '\0';
		if (buf[bn] == '\t')
			bn++;

		switch (idx) {
		case NSC_COL_EXPIRY:
			expiry = (lws_usec_t)((unsigned long long)atoll(col) *
					(lws_usec_t)LWS_US_PER_SEC);
			break;

		case NSC_COL_HOST:
		case NSC_COL_PATH:
		case NSC_COL_NAME:

			/*
			 * As we match the pieces of the wildcard,
			 * compose the matches into a specific tag
			 */

			if (tl + n + 2 > (int)max_tag)
				return 1;
			if (tl)
				tag[tl++] = LWSCTAG_SEP;
			memcpy(tag + tl, col, (size_t)n);
			tl += n;
			tag[tl] = '\0';
			break;
		default:
			break;
		}

		idx++;
	}

	if (pexpiry)
		*pexpiry = expiry;

	lwsl_info("%s: %.*s: tag '%s'\n", __func__, (int)size, buf, tag);

	return 0;
}